

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::B44Compressor::compress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  const_iterator cVar6;
  ChannelList *in_RCX;
  int in_EDX;
  void *in_RSI;
  ConstIterator *in_RDI;
  undefined8 *in_R8;
  int j;
  int i_4;
  int n_3;
  unsigned_short s [16];
  int x_1;
  unsigned_short *row3;
  unsigned_short *row2;
  unsigned_short *row1;
  unsigned_short *row0;
  int y_2;
  int n_2;
  ChannelData *cd_3;
  int i_3;
  char *outEnd;
  int n_1;
  ChannelData *cd_2;
  int i_2;
  int y_1;
  int n;
  int x;
  ChannelData *cd_1;
  int i_1;
  int y;
  ChannelData *cd;
  ConstIterator c;
  int i;
  unsigned_short *tmpBufferEnd;
  int maxY;
  int minY;
  int maxX;
  int minX;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  int local_dc;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a4;
  _Base_ptr local_a0;
  int local_94;
  long local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  int local_70;
  int local_6c;
  long *local_68;
  const_iterator local_60;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar7;
  _Base_ptr s_00;
  void *local_18;
  int local_4;
  
  *in_R8 = in_RDI[5]._i._M_node;
  if (in_EDX == 0) {
    local_4 = 0;
  }
  else {
    std::min<int>((int *)&(in_RCX->_map)._M_t._M_impl.super__Rb_tree_header,
                  (int *)((long)&in_RDI[9]._i._M_node + 4));
    iVar4 = *(int *)&(in_RCX->_map)._M_t._M_impl.field_0x4;
    piVar5 = std::min<int>((int *)&(in_RCX->_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   field_0x4,(int *)(in_RDI + 10));
    iVar1 = *piVar5;
    s_00 = in_RDI[4]._i._M_node;
    iVar7 = 0;
    cVar6._M_node = (_Base_ptr)ChannelList::begin(in_RCX);
    while( true ) {
      local_60._M_node = (_Base_ptr)ChannelList::end(in_RCX);
      bVar2 = Imf_2_5::operator!=(in_RDI,(ConstIterator *)in_RCX);
      if (!bVar2) break;
      local_68 = (long *)((long)in_RDI[8]._i._M_node + (long)iVar7 * 0x28);
      *local_68 = (long)s_00;
      local_68[1] = *local_68;
      ChannelList::ConstIterator::channel((ConstIterator *)0x24eb38);
      iVar3 = numSamples((int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RCX >> 0x20));
      *(int *)(local_68 + 2) = iVar3;
      ChannelList::ConstIterator::channel((ConstIterator *)0x24eb68);
      iVar3 = numSamples((int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RCX >> 0x20));
      *(int *)((long)local_68 + 0x14) = iVar3;
      s_00 = (_Base_ptr)
             ((long)&s_00->_M_color +
             (long)((int)local_68[2] * *(int *)((long)local_68 + 0x14) *
                   *(int *)((long)local_68 + 0x24)) * 2);
      ChannelList::ConstIterator::operator++(in_RDI);
      iVar7 = iVar7 + 1;
    }
    local_18 = in_RSI;
    if (*(int *)&in_RDI[3]._i._M_node == 1) {
      while (local_6c = iVar4, local_6c <= iVar1) {
        for (local_70 = 0; local_70 < *(int *)&in_RDI[6]._i._M_node; local_70 = local_70 + 1) {
          local_78 = (long)in_RDI[8]._i._M_node + (long)local_70 * 0x28;
          iVar4 = Imath_2_5::modp((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          if (iVar4 == 0) {
            if (*(int *)(local_78 + 0x1c) == 1) {
              for (local_7c = *(int *)(local_78 + 0x10); 0 < local_7c; local_7c = local_7c + -1) {
                Xdr::read<Imf_2_5::CharPtrIO,char_const*>((char **)in_RDI,(unsigned_short *)in_RCX);
                *(long *)(local_78 + 8) = *(long *)(local_78 + 8) + 2;
              }
            }
            else {
              local_80 = *(int *)(local_78 + 0x10) * *(int *)(local_78 + 0x24);
              memcpy(*(void **)(local_78 + 8),local_18,(long)local_80 << 1);
              local_18 = (void *)((long)local_80 * 2 + (long)local_18);
              *(long *)(local_78 + 8) = *(long *)(local_78 + 8) + (long)local_80 * 2;
            }
          }
        }
        iVar4 = local_6c + 1;
      }
    }
    else {
      while (local_84 = iVar4, local_84 <= iVar1) {
        for (local_88 = 0; local_88 < *(int *)&in_RDI[6]._i._M_node; local_88 = local_88 + 1) {
          local_90 = (long)in_RDI[8]._i._M_node + (long)local_88 * 0x28;
          iVar4 = Imath_2_5::modp((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          if (iVar4 == 0) {
            local_94 = *(int *)(local_90 + 0x10) * *(int *)(local_90 + 0x24);
            memcpy(*(void **)(local_90 + 8),local_18,(long)local_94 << 1);
            local_18 = (void *)((long)local_94 * 2 + (long)local_18);
            *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + (long)local_94 * 2;
          }
        }
        iVar4 = local_84 + 1;
      }
    }
    local_a0 = in_RDI[5]._i._M_node;
    for (local_a4 = 0; local_a4 < *(int *)&in_RDI[6]._i._M_node; local_a4 = local_a4 + 1) {
      local_b0 = (long *)((long)in_RDI[8]._i._M_node + (long)local_a4 * 0x28);
      if (*(int *)((long)local_b0 + 0x1c) == 1) {
        for (local_b8 = 0; local_b8 < *(int *)((long)local_b0 + 0x14); local_b8 = local_b8 + 4) {
          local_c0 = (undefined8 *)(*local_b0 + (long)(local_b8 * (int)local_b0[2]) * 2);
          local_c8 = (undefined8 *)((long)local_c0 + (long)(int)local_b0[2] * 2);
          local_d0 = (undefined8 *)((long)local_c8 + (long)(int)local_b0[2] * 2);
          local_d8 = (undefined8 *)((long)local_d0 + (long)(int)local_b0[2] * 2);
          if (*(int *)((long)local_b0 + 0x14) <= local_b8 + 3) {
            if (*(int *)((long)local_b0 + 0x14) <= local_b8 + 1) {
              local_c8 = local_c0;
            }
            if (*(int *)((long)local_b0 + 0x14) <= local_b8 + 2) {
              local_d0 = local_c8;
            }
            local_d8 = local_d0;
          }
          for (local_dc = 0; local_dc < (int)local_b0[2]; local_dc = local_dc + 4) {
            if (local_dc + 3 < (int)local_b0[2]) {
              local_108 = *local_c0;
              local_100 = *local_c8;
              local_f8 = *local_d0;
              local_f0 = *local_d8;
            }
            else {
              local_10c = (int)local_b0[2] - local_dc;
              for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
                local_118 = local_10c + -1;
                piVar5 = std::min<int>(&local_110,&local_118);
                local_114 = *piVar5;
                *(undefined2 *)((long)&local_108 + (long)local_110 * 2) =
                     *(undefined2 *)((long)local_c0 + (long)local_114 * 2);
                *(undefined2 *)((long)&local_108 + (long)(local_110 + 4) * 2) =
                     *(undefined2 *)((long)local_c8 + (long)local_114 * 2);
                *(undefined2 *)((long)&local_108 + (long)(local_110 + 8) * 2) =
                     *(undefined2 *)((long)local_d0 + (long)local_114 * 2);
                *(undefined2 *)((long)&local_108 + (long)(local_110 + 0xc) * 2) =
                     *(undefined2 *)((long)local_d8 + (long)local_114 * 2);
              }
            }
            local_c0 = local_c0 + 1;
            local_c8 = local_c8 + 1;
            local_d0 = local_d0 + 1;
            local_d8 = local_d8 + 1;
            if ((*(byte *)(local_b0 + 4) & 1) != 0) {
              anon_unknown_0::convertFromLinear((unsigned_short *)&local_108);
            }
            iVar4 = anon_unknown_0::pack
                              ((unsigned_short *)s_00,
                               (uchar *)CONCAT44(iVar7,in_stack_ffffffffffffffb0),
                               SUB81((ulong)cVar6._M_node >> 0x38,0),
                               SUB81((ulong)cVar6._M_node >> 0x30,0));
            local_a0 = (_Base_ptr)((long)&local_a0->_M_color + (long)iVar4);
          }
        }
      }
      else {
        local_b4 = (int)local_b0[2] * *(int *)((long)local_b0 + 0x14) *
                   *(int *)((long)local_b0 + 0x24) * 2;
        memcpy(local_a0,(void *)*local_b0,(long)local_b4);
        local_a0 = (_Base_ptr)((long)&local_a0->_M_color + (long)local_b4);
      }
    }
    local_4 = (int)local_a0 - (int)in_RDI[5]._i._M_node;
  }
  return local_4;
}

Assistant:

int
B44Compressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // Compress a block of pixel data:  First copy the input pixels
    // from the input buffer into _tmpBuffer, rearranging them such
    // that blocks of 4x4 pixels of a single channel can be accessed
    // conveniently.  Then compress each 4x4 block of HALF pixel data
    // and append the result to the output buffer.  Copy UINT and
    // FLOAT data to the output buffer without compressing them.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	//
	// Special case - empty input buffer.
	//

	return 0;
    }

    //
    // For each channel, detemine how many pixels are stored
    // in the input buffer, and where those pixels will be
    // placed in _tmpBuffer.
    //

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// The data in the input buffer are in the machine-independent
	// Xdr format.  Copy the HALF channels into _tmpBuffer and
	// convert them back into native format for compression.
	// Copy UINT and FLOAT channels verbatim into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::read <CharPtrIO> (inPtr, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		    inPtr += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	//
	// The input buffer contains only HALF channels, and they
	// are in native, machine-dependent format.  Copy the pixels
	// into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    //
    // The pixels for each channel have been packed into a contiguous
    // block in _tmpBuffer.  HALF channels are in native format; UINT
    // and FLOAT channels are in Xdr format.
    //

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // For each HALF channel, split the data in _tmpBuffer into 4x4
    // pixel blocks.  Compress each block and append the compressed
    // data to the output buffer.
    //
    // UINT and FLOAT channels are copied from _tmpBuffer into the
    // output buffer without further processing.
    //

    char *outEnd = _outBuffer;

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];
	
	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);
	    memcpy (outEnd, cd.start, n);
	    outEnd += n;

	    continue;
	}
	
	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    //
	    // Copy the next 4x4 pixel block into array s.
	    // If the width, cd.nx, or the height, cd.ny, of
	    // the pixel data in _tmpBuffer is not divisible
	    // by 4, then pad the data by repeating the
	    // rightmost column and the bottom row.
	    // 

	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    if (y + 3 >= cd.ny)
	    {
		if (y + 1 >= cd.ny)
		    row1 = row0;

		if (y + 2 >= cd.ny)
		    row2 = row1;

		row3 = row2;
	    }

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16];

		if (x + 3 >= cd.nx)
		{
		    int n = cd.nx - x;

		    for (int i = 0; i < 4; ++i)
		    {
			int j = min (i, n - 1);

			s[i +  0] = row0[j];
			s[i +  4] = row1[j];
			s[i +  8] = row2[j];
			s[i + 12] = row3[j];
		    }
		}
		else
		{
		    memcpy (&s[ 0], row0, 4 * sizeof (unsigned short));
		    memcpy (&s[ 4], row1, 4 * sizeof (unsigned short));
		    memcpy (&s[ 8], row2, 4 * sizeof (unsigned short));
		    memcpy (&s[12], row3, 4 * sizeof (unsigned short));
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;

		//
		// Compress the contents of array s and append the
		// results to the output buffer.
		//

		if (cd.pLinear)
		    convertFromLinear (s);

		outEnd += pack (s, (unsigned char *) outEnd,
				_optFlatFields, !cd.pLinear);
	    }
	}
    }

    return outEnd - _outBuffer;
}